

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::setBuffer
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,BufKind kind,void *p,
          size_t size)

{
  BufHdr *pBVar1;
  size_t sVar2;
  long in_RCX;
  BufHdr *in_RDX;
  int in_ESI;
  RefCount **in_RDI;
  Ptr<axl::rc::BufHdr> hdr;
  uint_t flags;
  size_t bufferSize;
  BufHdr *in_stack_ffffffffffffff98;
  BufHdr *in_stack_ffffffffffffffb0;
  Ptr local_40 [20];
  undefined4 local_2c;
  long local_28;
  
  local_28 = in_RCX + -0x28;
  local_2c = 0;
  if (in_ESI != 1) {
    local_2c = 4;
  }
  rc::BufHdr::BufHdr(in_stack_ffffffffffffffb0,(size_t)in_RDI,(uintptr_t)in_RDX);
  rc::primeRefCount<axl::rc::BufHdr>(in_RDX,(FreeFunc *)in_stack_ffffffffffffff98);
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
            ((Ptr<axl::rc::BufHdr> *)in_RDX,in_stack_ffffffffffffff98);
  if (in_RDI[1] != (RefCount *)0x0) {
    rc::RefCount::release(&in_RDX->super_RefCount);
  }
  pBVar1 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
  *in_RDI = &pBVar1[1].super_RefCount;
  *(undefined1 *)&(*in_RDI)->_vptr_RefCount = 0;
  pBVar1 = rc::Ptr<axl::rc::BufHdr>::detach
                     ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffffb0,in_RDI);
  in_RDI[1] = &pBVar1->super_RefCount;
  in_RDI[2] = (RefCount *)0x0;
  *(undefined1 *)(in_RDI + 3) = 1;
  sVar2 = local_28 - 1;
  rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x12c041);
  return sVar2;
}

Assistant:

size_t
	setBuffer(
		rc::BufKind kind,
		void* p,
		size_t size
	) {
		ASSERT(size >= sizeof(rc::BufHdr) + sizeof(C));

		size_t bufferSize = size - sizeof(rc::BufHdr);
		uint_t flags = kind != rc::BufKind_Static ? rc::BufHdrFlag_Exclusive : 0;

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_INPLACE(rc::BufHdr, (bufferSize, flags), p, NULL);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = (C*)(hdr + 1);
		this->m_p[0] = 0;
		this->m_hdr = hdr.detach();
		this->m_length = 0;
		this->m_isNullTerminated = true;
		return bufferSize / sizeof(C) - 1;
	}